

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TtCofactorTest10(word *pTruth,int nVars,int N)

{
  ulong uVar1;
  ulong uVar2;
  word wVar3;
  uint uVar4;
  int iVar5;
  uint *pTruthU;
  long lVar6;
  word *pwVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint iVar;
  word *pLimit;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  ulong uVar14;
  
  if (1 < nVars) {
    uVar4 = 1 << ((char)nVars - 6U & 0x1f);
    if ((uint)nVars < 7) {
      uVar4 = 1;
    }
    uVar11 = (ulong)uVar4;
    iVar = 0;
    do {
      if ((int)uVar4 < 1) {
        Abc_TtSwapVars(Abc_TtCofactorTest10::pCopy2,nVars,iVar,iVar + 1);
      }
      else {
        lVar6 = 0;
        do {
          *(undefined8 *)((long)Abc_TtCofactorTest10::pCopy1 + lVar6) =
               *(undefined8 *)((long)pTruth + lVar6);
          lVar6 = lVar6 + 8;
        } while (uVar11 * 8 - lVar6 != 0);
        if ((int)iVar < 5) {
          uVar10 = s_PMasks[(int)iVar][0];
          uVar14 = s_PMasks[(int)iVar][1];
          uVar1 = s_PMasks[(int)iVar][2];
          lVar6 = 0;
          do {
            uVar2 = *(ulong *)((long)Abc_TtCofactorTest10::pCopy1 + lVar6);
            bVar8 = (byte)(1 << ((byte)iVar & 0x1f));
            *(ulong *)((long)Abc_TtCofactorTest10::pCopy1 + lVar6) =
                 (uVar2 & uVar1) >> (bVar8 & 0x3f) |
                 (uVar2 & uVar14) << (bVar8 & 0x3f) | uVar2 & uVar10;
            lVar6 = lVar6 + 8;
          } while (uVar11 * 8 - lVar6 != 0);
        }
        else if (iVar == 5) {
          pwVar7 = Abc_TtCofactorTest10::pCopy1;
          do {
            *(ulong *)((long)pwVar7 + 4) =
                 CONCAT44((int)*(undefined8 *)((long)pwVar7 + 4),
                          (int)((ulong)*(undefined8 *)((long)pwVar7 + 4) >> 0x20));
            pwVar7 = pwVar7 + 2;
          } while (pwVar7 < Abc_TtCofactorTest10::pCopy1 + uVar11);
        }
        else {
          uVar10 = (ulong)(uint)(1 << ((byte)iVar - 6 & 0x1f));
          if (iVar < 7) {
            uVar10 = 1;
          }
          iVar5 = (int)uVar10;
          iVar9 = iVar5 * 4;
          pwVar7 = Abc_TtCofactorTest10::pCopy1 + (uint)(iVar5 * 2);
          pwVar12 = Abc_TtCofactorTest10::pCopy1 + uVar10;
          pwVar13 = Abc_TtCofactorTest10::pCopy1;
          do {
            if (0 < iVar5) {
              uVar14 = 0;
              do {
                wVar3 = pwVar12[uVar14];
                pwVar12[uVar14] = pwVar7[uVar14];
                pwVar7[uVar14] = wVar3;
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
            pwVar13 = pwVar13 + iVar9;
            pwVar7 = pwVar7 + iVar9;
            pwVar12 = pwVar12 + iVar9;
          } while (pwVar13 < Abc_TtCofactorTest10::pCopy1 + uVar11);
        }
        lVar6 = 0;
        uVar10 = uVar11;
        do {
          *(undefined8 *)((long)Abc_TtCofactorTest10::pCopy2 + lVar6) =
               *(undefined8 *)((long)pTruth + lVar6);
          lVar6 = lVar6 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        Abc_TtSwapVars(Abc_TtCofactorTest10::pCopy2,nVars,iVar,iVar + 1);
        lVar6 = 0;
        uVar10 = uVar11;
        do {
          if (*(long *)((long)Abc_TtCofactorTest10::pCopy1 + lVar6) !=
              *(long *)((long)Abc_TtCofactorTest10::pCopy2 + lVar6)) {
            __assert_fail("Abc_TtEqual( pCopy1, pCopy2, nWords )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                          ,0x2d0,"void Abc_TtCofactorTest10(word *, int, int)");
          }
          lVar6 = lVar6 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      iVar = iVar + 1;
    } while ((int)iVar < nVars + -1);
  }
  return;
}

Assistant:

void Abc_TtCofactorTest10( word * pTruth, int nVars, int N )
{
    static word pCopy1[1024];
    static word pCopy2[1024];
    int nWords = Abc_TtWordNum( nVars );
    int i;
    for ( i = 0; i < nVars - 1; i++ )
    {
//        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy1, nWords, i );
//        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
        Abc_TtSwapVars( pCopy2, nVars, i, i+1 );
//        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        assert( Abc_TtEqual( pCopy1, pCopy2, nWords ) );
    }
}